

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O0

bool __thiscall cmEventBasedConnection::OnConnectionShuttingDown(cmEventBasedConnection *this)

{
  cmEventBasedConnection *this_local;
  
  if (this->WriteStream != (uv_stream_t *)0x0) {
    this->WriteStream->data = (void *)0x0;
  }
  if (this->ReadStream != (uv_stream_t *)0x0) {
    this->ReadStream->data = (void *)0x0;
  }
  this->ReadStream = (uv_stream_t *)0x0;
  this->WriteStream = (uv_stream_t *)0x0;
  return true;
}

Assistant:

bool cmEventBasedConnection::OnConnectionShuttingDown()
{
  if (this->WriteStream) {
    this->WriteStream->data = nullptr;
  }
  if (this->ReadStream) {
    this->ReadStream->data = nullptr;
  }
  this->ReadStream = nullptr;
  this->WriteStream = nullptr;
  return true;
}